

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::TestEventRepeater::~TestEventRepeater(TestEventRepeater *this)

{
  TestEventListener *in_RDI;
  vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_> *unaff_retaddr
  ;
  
  in_RDI->_vptr_TestEventListener = (_func_int **)&PTR__TestEventRepeater_001f8de8;
  ForEach<std::vector<testing::TestEventListener*,std::allocator<testing::TestEventListener*>>,void(*)(testing::TestEventListener*)>
            (unaff_retaddr,(_func_void_TestEventListener_ptr *)in_RDI);
  std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::~vector
            (unaff_retaddr);
  TestEventListener::~TestEventListener(in_RDI);
  return;
}

Assistant:

TestEventRepeater::~TestEventRepeater() {
  ForEach(listeners_, Delete<TestEventListener>);
}